

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config-c.cpp
# Opt level: O2

duckdb_state duckdb_create_config(duckdb_config *out_config)

{
  DBConfig *this;
  allocator local_79;
  string local_78;
  Value local_58;
  
  if (out_config != (duckdb_config *)0x0) {
    *out_config = (duckdb_config)0x0;
    this = (DBConfig *)operator_new(0x6a0);
    duckdb::DBConfig::DBConfig(this);
    *out_config = (duckdb_config)this;
    std::__cxx11::string::string((string *)&local_78,"duckdb_api",&local_79);
    duckdb::Value::Value(&local_58,"capi");
    duckdb::DBConfig::SetOptionByName(this,&local_78,&local_58);
    duckdb::Value::~Value(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return (uint)(out_config == (duckdb_config *)0x0);
}

Assistant:

duckdb_state duckdb_create_config(duckdb_config *out_config) {
	if (!out_config) {
		return DuckDBError;
	}
	try {
		*out_config = nullptr;
		auto config = new DBConfig();
		*out_config = reinterpret_cast<duckdb_config>(config);
		config->SetOptionByName("duckdb_api", "capi");
	} catch (...) { // LCOV_EXCL_START
		return DuckDBError;
	} // LCOV_EXCL_STOP
	return DuckDBSuccess;
}